

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_schema_entry.cpp
# Opt level: O3

optional_ptr<duckdb::CatalogEntry,_true> __thiscall
duckdb::DuckSchemaEntry::AddEntry
          (DuckSchemaEntry *this,CatalogTransaction transaction,
          unique_ptr<duckdb::StandardEntry,_std::default_delete<duckdb::StandardEntry>,_true> *entry
          ,OnCreateConflict on_conflict)

{
  CatalogTransaction transaction_00;
  pointer pSVar1;
  optional_ptr<duckdb::CatalogEntry,_true> oVar2;
  __alloc_node_gen_t __alloc_node_gen;
  LogicalDependencyList dependencies;
  _Head_base<0UL,_duckdb::StandardEntry_*,_false> local_e0;
  DuckSchemaEntry *local_d8;
  _AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::LogicalDependency,_true>_>_> local_d0;
  DatabaseInstance *local_c8;
  ClientContext *pCStack_c0;
  Transaction *local_b8;
  transaction_t tStack_b0;
  transaction_t local_a8;
  _Hashtable<duckdb::LogicalDependency,_duckdb::LogicalDependency,_std::allocator<duckdb::LogicalDependency>,_std::__detail::_Identity,_duckdb::LogicalDependencyEquality,_duckdb::LogicalDependencyHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_a0;
  _Hashtable<duckdb::LogicalDependency,_duckdb::LogicalDependency,_std::allocator<duckdb::LogicalDependency>,_std::__detail::_Identity,_duckdb::LogicalDependencyEquality,_duckdb::LogicalDependencyHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  local_d8 = this;
  pSVar1 = unique_ptr<duckdb::StandardEntry,_std::default_delete<duckdb::StandardEntry>,_true>::
           operator->(entry);
  local_68._M_buckets = (__buckets_ptr)0x0;
  local_68._M_bucket_count = (pSVar1->dependencies).set._M_h._M_bucket_count;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = (pSVar1->dependencies).set._M_h._M_element_count;
  local_68._M_rehash_policy._M_max_load_factor =
       (pSVar1->dependencies).set._M_h._M_rehash_policy._M_max_load_factor;
  local_68._M_rehash_policy._4_4_ =
       *(undefined4 *)&(pSVar1->dependencies).set._M_h._M_rehash_policy.field_0x4;
  local_68._M_rehash_policy._M_next_resize =
       (pSVar1->dependencies).set._M_h._M_rehash_policy._M_next_resize;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  local_d0._M_h = (__hashtable_alloc *)&local_68;
  ::std::
  _Hashtable<duckdb::LogicalDependency,duckdb::LogicalDependency,std::allocator<duckdb::LogicalDependency>,std::__detail::_Identity,duckdb::LogicalDependencyEquality,duckdb::LogicalDependencyHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _M_assign<std::_Hashtable<duckdb::LogicalDependency,duckdb::LogicalDependency,std::allocator<duckdb::LogicalDependency>,std::__detail::_Identity,duckdb::LogicalDependencyEquality,duckdb::LogicalDependencyHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::LogicalDependency,true>>>>
            ((_Hashtable<duckdb::LogicalDependency,duckdb::LogicalDependency,std::allocator<duckdb::LogicalDependency>,std::__detail::_Identity,duckdb::LogicalDependencyEquality,duckdb::LogicalDependencyHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)&local_68,
             (_Hashtable<duckdb::LogicalDependency,_duckdb::LogicalDependency,_std::allocator<duckdb::LogicalDependency>,_std::__detail::_Identity,_duckdb::LogicalDependencyEquality,_duckdb::LogicalDependencyHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              *)&pSVar1->dependencies,&local_d0);
  local_c8 = transaction.db.ptr;
  pCStack_c0 = transaction.context.ptr;
  local_b8 = transaction.transaction.ptr;
  tStack_b0 = transaction.transaction_id;
  local_a8 = transaction.start_time;
  local_e0._M_head_impl =
       (entry->super_unique_ptr<duckdb::StandardEntry,_std::default_delete<duckdb::StandardEntry>_>)
       ._M_t.
       super___uniq_ptr_impl<duckdb::StandardEntry,_std::default_delete<duckdb::StandardEntry>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::StandardEntry_*,_std::default_delete<duckdb::StandardEntry>_>.
       super__Head_base<0UL,_duckdb::StandardEntry_*,_false>._M_head_impl;
  (entry->super_unique_ptr<duckdb::StandardEntry,_std::default_delete<duckdb::StandardEntry>_>)._M_t
  .super___uniq_ptr_impl<duckdb::StandardEntry,_std::default_delete<duckdb::StandardEntry>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::StandardEntry_*,_std::default_delete<duckdb::StandardEntry>_>.
  super__Head_base<0UL,_duckdb::StandardEntry_*,_false>._M_head_impl = (StandardEntry *)0x0;
  local_d0._M_h = (__hashtable_alloc *)&local_a0;
  local_a0._M_buckets = (__buckets_ptr)0x0;
  local_a0._M_bucket_count = local_68._M_bucket_count;
  local_a0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_a0._M_element_count = local_68._M_element_count;
  local_a0._M_rehash_policy._M_max_load_factor = local_68._M_rehash_policy._M_max_load_factor;
  local_a0._M_rehash_policy._4_4_ = local_68._M_rehash_policy._4_4_;
  local_a0._M_rehash_policy._M_next_resize = local_68._M_rehash_policy._M_next_resize;
  local_a0._M_single_bucket = (__node_base_ptr)0x0;
  ::std::
  _Hashtable<duckdb::LogicalDependency,duckdb::LogicalDependency,std::allocator<duckdb::LogicalDependency>,std::__detail::_Identity,duckdb::LogicalDependencyEquality,duckdb::LogicalDependencyHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _M_assign<std::_Hashtable<duckdb::LogicalDependency,duckdb::LogicalDependency,std::allocator<duckdb::LogicalDependency>,std::__detail::_Identity,duckdb::LogicalDependencyEquality,duckdb::LogicalDependencyHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::LogicalDependency,true>>>>
            ((_Hashtable<duckdb::LogicalDependency,duckdb::LogicalDependency,std::allocator<duckdb::LogicalDependency>,std::__detail::_Identity,duckdb::LogicalDependencyEquality,duckdb::LogicalDependencyHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)local_d0._M_h,&local_68,&local_d0);
  transaction_00.context.ptr = pCStack_c0;
  transaction_00.db.ptr = local_c8;
  transaction_00.transaction.ptr = local_b8;
  transaction_00.transaction_id = tStack_b0;
  transaction_00.start_time = local_a8;
  oVar2 = AddEntryInternal(local_d8,transaction_00,
                           (unique_ptr<duckdb::StandardEntry,_std::default_delete<duckdb::StandardEntry>,_true>
                            *)&local_e0,on_conflict,(LogicalDependencyList *)&local_a0);
  ::std::
  _Hashtable<duckdb::LogicalDependency,_duckdb::LogicalDependency,_std::allocator<duckdb::LogicalDependency>,_std::__detail::_Identity,_duckdb::LogicalDependencyEquality,_duckdb::LogicalDependencyHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_a0);
  if (local_e0._M_head_impl != (StandardEntry *)0x0) {
    (*((local_e0._M_head_impl)->super_InCatalogEntry).super_CatalogEntry._vptr_CatalogEntry[1])();
  }
  local_e0._M_head_impl = (StandardEntry *)0x0;
  ::std::
  _Hashtable<duckdb::LogicalDependency,_duckdb::LogicalDependency,_std::allocator<duckdb::LogicalDependency>,_std::__detail::_Identity,_duckdb::LogicalDependencyEquality,_duckdb::LogicalDependencyHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_68);
  return (optional_ptr<duckdb::CatalogEntry,_true>)oVar2.ptr;
}

Assistant:

optional_ptr<CatalogEntry> DuckSchemaEntry::AddEntry(CatalogTransaction transaction, unique_ptr<StandardEntry> entry,
                                                     OnCreateConflict on_conflict) {
	LogicalDependencyList dependencies = entry->dependencies;
	return AddEntryInternal(transaction, std::move(entry), on_conflict, dependencies);
}